

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

int handle_connection(int sockfd,ptls_context_t *ctx,char *server_name,char *input_file,
                     ptls_handshake_properties_t *hsprop,int request_key_update)

{
  ptls_early_data_acceptance_t pVar1;
  ulong *puVar2;
  ptls_buffer_t *ppVar3;
  ulong uVar4;
  int __fd;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ptls_t *tls;
  size_t sVar10;
  int *piVar11;
  ulong uVar12;
  char *__format;
  ulong uVar13;
  long lVar14;
  ptls_buffer_t encbuf;
  ptls_buffer_t ptbuf;
  timeval timeout;
  fd_set exceptfds;
  fd_set readfds;
  fd_set writefds;
  char bytebuf [16384];
  uint local_4288;
  int local_4284;
  size_t local_4260;
  ptls_buffer_t local_4258;
  ulong local_4238;
  int local_422c;
  ptls_buffer_t local_4228;
  char *local_4200;
  ptls_buffer_t local_41f8;
  char *local_41d0;
  timeval local_41c8;
  fd_set local_41b8;
  fd_set local_4138;
  fd_set local_40b8;
  undefined1 local_4038 [16392];
  
  local_422c = request_key_update;
  tls = ptls_new(ctx,(uint)(server_name == (char *)0x0));
  local_41f8.base = "";
  local_41f8.capacity = 0;
  local_41f8.off = 0;
  local_41f8._24_8_ = (ulong)(uint)local_41f8._28_4_ << 0x20;
  local_4258.base = "";
  local_4258.capacity = 0;
  local_4258.off = 0;
  local_4258._24_8_ = (ulong)(uint)local_4258._28_4_ << 0x20;
  local_4228.base = "";
  local_4228.capacity = 0;
  local_4228.off = 0;
  local_4288 = 0;
  local_4228._24_8_ = (ulong)(uint)local_4228._28_4_ << 0x20;
  fcntl(sockfd,4,0x800);
  __fd = 0;
  if ((input_file != (char *)0x0) && (__fd = open(input_file,0), __fd == -1)) {
    handle_connection_cold_2();
    __fd = -1;
LAB_00107437:
    uVar5 = 1;
LAB_001074ad:
    if (sockfd != -1) {
      close(sockfd);
    }
    if (__fd != -1 && input_file != (char *)0x0) {
      close(__fd);
    }
    ptls_buffer__release_memory(&local_41f8);
    local_41f8.off = 0;
    local_41f8.is_allocated = 0;
    local_41f8._28_4_ = 0;
    local_41f8.base = (uint8_t *)0x0;
    local_41f8.capacity = 0;
    ptls_buffer__release_memory(&local_4258);
    local_4258.off = 0;
    local_4258.is_allocated = 0;
    local_4258._28_4_ = 0;
    local_4258.base = (uint8_t *)0x0;
    local_4258.capacity = 0;
    ptls_buffer__release_memory(&local_4228);
    local_4228.off = 0;
    local_4228.is_allocated = 0;
    local_4228._28_4_ = 0;
    local_4228.base = (uint8_t *)0x0;
    local_4228.capacity = 0;
    ptls_free(tls);
    return uVar5;
  }
  if (server_name != (char *)0x0) {
    ptls_set_server_name(tls,server_name,0);
    uVar5 = ptls_handshake(tls,&local_4258,(void *)0x0,(size_t *)0x0,hsprop);
    local_4288 = 0x202;
    if (uVar5 != 0x202) {
      fprintf(_stderr,"ptls_handshake:%d\n",(ulong)uVar5);
      goto LAB_00107437;
    }
  }
  iVar6 = sockfd + 0x3f;
  if (-1 < sockfd) {
    iVar6 = sockfd;
  }
  uVar12 = 1L << ((byte)sockfd & 0x3f);
  iVar6 = iVar6 >> 6;
  local_4238 = 0;
  local_4284 = 0;
  local_4200 = input_file;
  local_41d0 = server_name;
LAB_00106ee7:
  iVar7 = __fd + 0x3f;
  if (-1 < __fd) {
    iVar7 = __fd;
  }
  uVar13 = 1L << ((byte)__fd & 0x3f);
  iVar7 = iVar7 >> 6;
  iVar9 = sockfd;
  if (sockfd < __fd) {
    iVar9 = __fd;
  }
  do {
    local_4138.fds_bits[0xe] = 0;
    local_4138.fds_bits[0xf] = 0;
    local_4138.fds_bits[0xc] = 0;
    local_4138.fds_bits[0xd] = 0;
    local_4138.fds_bits[10] = 0;
    local_4138.fds_bits[0xb] = 0;
    local_4138.fds_bits[8] = 0;
    local_4138.fds_bits[9] = 0;
    local_4138.fds_bits[6] = 0;
    local_4138.fds_bits[7] = 0;
    local_4138.fds_bits[4] = 0;
    local_4138.fds_bits[5] = 0;
    local_4138.fds_bits[2] = 0;
    local_4138.fds_bits[3] = 0;
    local_4138.fds_bits[0] = 0;
    local_4138.fds_bits[1] = 0;
    local_40b8.fds_bits[0] = 0;
    local_40b8.fds_bits[1] = 0;
    local_40b8.fds_bits[2] = 0;
    local_40b8.fds_bits[3] = 0;
    local_40b8.fds_bits[4] = 0;
    local_40b8.fds_bits[5] = 0;
    local_40b8.fds_bits[6] = 0;
    local_40b8.fds_bits[7] = 0;
    local_40b8.fds_bits[8] = 0;
    local_40b8.fds_bits[9] = 0;
    local_40b8.fds_bits[10] = 0;
    local_40b8.fds_bits[0xb] = 0;
    local_40b8.fds_bits[0xc] = 0;
    local_40b8.fds_bits[0xd] = 0;
    local_40b8.fds_bits[0xe] = 0;
    local_40b8.fds_bits[0xf] = 0;
    local_41b8.fds_bits[0] = 0;
    local_41b8.fds_bits[1] = 0;
    local_41b8.fds_bits[2] = 0;
    local_41b8.fds_bits[3] = 0;
    local_41b8.fds_bits[4] = 0;
    local_41b8.fds_bits[5] = 0;
    local_41b8.fds_bits[6] = 0;
    local_41b8.fds_bits[7] = 0;
    local_41b8.fds_bits[8] = 0;
    local_41b8.fds_bits[9] = 0;
    local_41b8.fds_bits[10] = 0;
    local_41b8.fds_bits[0xb] = 0;
    local_4138.fds_bits[iVar6] = local_4138.fds_bits[iVar6] | uVar12;
    local_41b8.fds_bits[0xc] = 0;
    local_41b8.fds_bits[0xd] = 0;
    local_41b8.fds_bits[0xe] = 0;
    local_41b8.fds_bits[0xf] = 0;
    if (local_4258.off != 0) {
      local_40b8.fds_bits[iVar6] = local_40b8.fds_bits[iVar6] | uVar12;
    }
    local_41b8.fds_bits[iVar6] = local_41b8.fds_bits[iVar6] | uVar12;
    iVar8 = sockfd;
    if (__fd != -1) {
      local_4138.fds_bits[iVar7] = local_4138.fds_bits[iVar7] | uVar13;
      local_41b8.fds_bits[iVar7] = local_41b8.fds_bits[iVar7] | uVar13;
      iVar8 = iVar9;
    }
    local_41c8.tv_sec = 0;
    if (local_4258.off == 0) {
      local_41c8.tv_sec = 0xe10;
    }
    local_41c8.tv_usec = 0;
    iVar8 = select(iVar8 + 1,&local_4138,&local_40b8,&local_41b8,&local_41c8);
  } while (iVar8 == -1);
  if (((local_4138.fds_bits[iVar6] & uVar12) == 0) && ((local_41b8.fds_bits[iVar6] & uVar12) == 0))
  goto LAB_00107236;
  do {
    sVar10 = read(sockfd,local_4038,0x4000);
    if (sVar10 != 0xffffffffffffffff) {
      if ((long)sVar10 < 1) goto LAB_0010749e;
      lVar14 = 0;
      local_4260 = sVar10;
      goto LAB_001070e6;
    }
    piVar11 = __errno_location();
  } while (*piVar11 == 4);
  if (*piVar11 != 0xb) goto LAB_0010749e;
LAB_00107236:
  uVar4 = local_4238;
  if (__fd == -1) {
    __fd = -1;
  }
  else if (((local_4138.fds_bits[iVar7] & uVar13) != 0) ||
          ((local_41b8.fds_bits[iVar7] & uVar13) != 0)) {
    do {
      sVar10 = read(__fd,local_4038,0x4000);
      if (sVar10 != 0xffffffffffffffff) {
        if (0 < (long)sVar10) {
          local_4288 = ptls_buffer__do_pushv(&local_4228,local_4038,sVar10);
          if (local_4288 != 0) goto LAB_0010749e;
          if (local_4284 == 0) {
            if (local_41d0 != (char *)0x0) {
              local_4288 = 0;
              puVar2 = (hsprop->field_0).client.max_early_data_size;
              uVar4 = local_4238;
              if (puVar2 == (ulong *)0x0) goto LAB_00107311;
              uVar13 = *puVar2;
              sVar10 = local_4228.off;
              if (uVar13 < local_4228.off) {
                sVar10 = uVar13;
              }
              if ((sVar10 - local_4238 == 0) ||
                 (uVar5 = ptls_send(tls,&local_4258,local_4228.base,sVar10 - local_4238),
                 uVar4 = sVar10, uVar5 == 0)) goto LAB_00107311;
              fprintf(_stderr,"ptls_send(early_data):%d\n",(ulong)uVar5);
              local_4288 = 1;
              goto LAB_0010749e;
            }
          }
          else {
            uVar5 = ptls_send(tls,&local_4258,local_4038,sVar10);
            if (uVar5 != 0) {
              fprintf(_stderr,"ptls_send(1rtt):%d\n",(ulong)uVar5);
              local_4288 = 1;
              goto LAB_0010749e;
            }
            local_4228.off = 0;
          }
          local_4288 = 0;
          uVar4 = local_4238;
          goto LAB_00107311;
        }
        break;
      }
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    if (local_4200 != (char *)0x0) {
      close(__fd);
    }
    __fd = -1;
    uVar4 = local_4238;
  }
LAB_00107311:
  local_4238 = uVar4;
  if (local_4258.off != 0) {
    do {
      sVar10 = write(sockfd,local_4258.base,local_4258.off);
      if (sVar10 != 0xffffffffffffffff) {
        if ((long)sVar10 < 1) goto LAB_0010749e;
        shift_buffer(&local_4258,sVar10);
        goto LAB_0010735d;
      }
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    if (*piVar11 != 0xb) goto LAB_0010749e;
  }
LAB_0010735d:
  if (__fd == -1 && local_4284 == 1) {
    shutdown(sockfd,1);
    local_4284 = 2;
  }
  goto LAB_00106ee7;
LAB_001070e6:
  do {
    if (local_4284 == 0) {
      local_4288 = ptls_handshake(tls,&local_4258,local_4038 + lVar14,&local_4260,hsprop);
      if (local_4288 != 0x202) {
        if (local_4288 == 0) {
          iVar9 = ptls_is_server(tls);
          pVar1 = (hsprop->field_0).client.early_data_acceptance;
          if (iVar9 == 0 && pVar1 == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN) {
            __assert_fail("ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/cli.c"
                          ,0x8a,
                          "int handle_connection(int, ptls_context_t *, const char *, const char *, ptls_handshake_properties_t *, int)"
                         );
          }
          if (pVar1 == PTLS_EARLY_DATA_ACCEPTED) {
            shift_buffer(&local_4228,local_4238);
          }
          if (local_422c != 0) {
            ptls_update_key(tls,1);
          }
          if (local_4228.off != 0) {
            local_4288 = ptls_send(tls,&local_4258,local_4228.base,local_4228.off);
            local_4284 = 1;
            ppVar3 = &local_4228;
            if (local_4288 == 0) goto LAB_001071fb;
            __format = "ptls_send(1rtt):%d\n";
            goto LAB_0010748d;
          }
          local_4284 = 1;
          goto LAB_00107202;
        }
        handle_connection_cold_1();
        goto LAB_0010749e;
      }
      local_4284 = 0;
    }
    else {
      local_4288 = ptls_receive(tls,&local_41f8,local_4038 + lVar14,&local_4260);
      if (local_4288 != 0x202) {
        if (local_4288 != 0) {
          __format = "ptls_receive:%d\n";
LAB_0010748d:
          fprintf(_stderr,__format,(ulong)local_4288);
          goto LAB_0010749e;
        }
        if (local_41f8.off != 0) {
          write(1,local_41f8.base,local_41f8.off);
          ppVar3 = &local_41f8;
LAB_001071fb:
          ppVar3->off = 0;
        }
LAB_00107202:
        local_4288 = 0;
      }
    }
    lVar14 = lVar14 + local_4260;
    local_4260 = sVar10 - lVar14;
  } while (local_4260 != 0);
  goto LAB_00107236;
LAB_0010749e:
  uVar5 = (uint)(local_4288 != 0);
  input_file = local_4200;
  goto LAB_001074ad;
}

Assistant:

static int handle_connection(int sockfd, ptls_context_t *ctx, const char *server_name, const char *input_file,
                             ptls_handshake_properties_t *hsprop, int request_key_update)
{
    ptls_t *tls = ptls_new(ctx, server_name == NULL);
    ptls_buffer_t rbuf, encbuf, ptbuf;
    char bytebuf[16384];
    enum { IN_HANDSHAKE, IN_1RTT, IN_SHUTDOWN } state = IN_HANDSHAKE;
    int inputfd = 0, ret = 0;
    size_t early_bytes_sent = 0;
    ssize_t ioret;

    ptls_buffer_init(&rbuf, "", 0);
    ptls_buffer_init(&encbuf, "", 0);
    ptls_buffer_init(&ptbuf, "", 0);

    fcntl(sockfd, F_SETFL, O_NONBLOCK);

    if (input_file != NULL) {
        if ((inputfd = open(input_file, O_RDONLY)) == -1) {
            fprintf(stderr, "failed to open file:%s:%s\n", input_file, strerror(errno));
            ret = 1;
            goto Exit;
        }
    }
    if (server_name != NULL) {
        ptls_set_server_name(tls, server_name, 0);
        if ((ret = ptls_handshake(tls, &encbuf, NULL, NULL, hsprop)) != PTLS_ERROR_IN_PROGRESS) {
            fprintf(stderr, "ptls_handshake:%d\n", ret);
            ret = 1;
            goto Exit;
        }
    }

    while (1) {
        /* check if data is available */
        fd_set readfds, writefds, exceptfds;
        int maxfd = 0;
        struct timeval timeout;
        do {
            FD_ZERO(&readfds);
            FD_ZERO(&writefds);
            FD_ZERO(&exceptfds);
            FD_SET(sockfd, &readfds);
            if (encbuf.off != 0)
                FD_SET(sockfd, &writefds);
            FD_SET(sockfd, &exceptfds);
            maxfd = sockfd + 1;
            if (inputfd != -1) {
                FD_SET(inputfd, &readfds);
                FD_SET(inputfd, &exceptfds);
                if (maxfd <= inputfd)
                    maxfd = inputfd + 1;
            }
            timeout.tv_sec = encbuf.off != 0 ? 0 : 3600;
            timeout.tv_usec = 0;
        } while (select(maxfd, &readfds, &writefds, &exceptfds, &timeout) == -1);

        /* consume incoming messages */
        if (FD_ISSET(sockfd, &readfds) || FD_ISSET(sockfd, &exceptfds)) {
            size_t off = 0, leftlen;
            while ((ioret = read(sockfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
                ioret = 0;
            } else if (ioret <= 0) {
                goto Exit;
            }
            while ((leftlen = ioret - off) != 0) {
                if (state == IN_HANDSHAKE) {
                    if ((ret = ptls_handshake(tls, &encbuf, bytebuf + off, &leftlen, hsprop)) == 0) {
                        state = IN_1RTT;
                        assert(ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
                        /* release data sent as early-data, if server accepted it */
                        if (hsprop->client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED)
                            shift_buffer(&ptbuf, early_bytes_sent);
                        if (request_key_update)
                            ptls_update_key(tls, 1);
                        if (ptbuf.off != 0) {
                            if ((ret = ptls_send(tls, &encbuf, ptbuf.base, ptbuf.off)) != 0) {
                                fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                                goto Exit;
                            }
                            ptbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        if (encbuf.off != 0)
                            (void)write(sockfd, encbuf.base, encbuf.off);
                        fprintf(stderr, "ptls_handshake:%d\n", ret);
                        goto Exit;
                    }
                } else {
                    if ((ret = ptls_receive(tls, &rbuf, bytebuf + off, &leftlen)) == 0) {
                        if (rbuf.off != 0) {
                            write(1, rbuf.base, rbuf.off);
                            rbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        fprintf(stderr, "ptls_receive:%d\n", ret);
                        goto Exit;
                    }
                }
                off += leftlen;
            }
        }

        /* read input (and send if possible) */
        if (inputfd != -1 && (FD_ISSET(inputfd, &readfds) || FD_ISSET(inputfd, &exceptfds))) {
            while ((ioret = read(inputfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret > 0) {
                ptls_buffer_pushv(&ptbuf, bytebuf, ioret);
                if (state == IN_HANDSHAKE) {
                    size_t send_amount = 0;
                    if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
                        size_t max_can_be_sent = *hsprop->client.max_early_data_size;
                        if (max_can_be_sent > ptbuf.off)
                            max_can_be_sent = ptbuf.off;
                        send_amount = max_can_be_sent - early_bytes_sent;
                    }
                    if (send_amount != 0) {
                        if ((ret = ptls_send(tls, &encbuf, ptbuf.base, send_amount)) != 0) {
                            fprintf(stderr, "ptls_send(early_data):%d\n", ret);
                            goto Exit;
                        }
                        early_bytes_sent += send_amount;
                    }
                } else {
                    if ((ret = ptls_send(tls, &encbuf, bytebuf, ioret)) != 0) {
                        fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                        goto Exit;
                    }
                    ptbuf.off = 0;
                }
            } else {
                /* closed */
                if (input_file != NULL)
                    close(inputfd);
                inputfd = -1;
            }
        }

        /* send any data */
        if (encbuf.off != 0) {
            while ((ioret = write(sockfd, encbuf.base, encbuf.off)) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
            } else if (ioret <= 0) {
                goto Exit;
            } else {
                shift_buffer(&encbuf, ioret);
            }
        }

        /* close the sender side when necessary */
        if (state == IN_1RTT && inputfd == -1) {
            /* FIXME send close_alert */
            shutdown(sockfd, SHUT_WR);
            state = IN_SHUTDOWN;
        }
    }

Exit:
    if (sockfd != -1)
        close(sockfd);
    if (input_file != NULL && inputfd != -1)
        close(inputfd);
    ptls_buffer_dispose(&rbuf);
    ptls_buffer_dispose(&encbuf);
    ptls_buffer_dispose(&ptbuf);
    ptls_free(tls);
    return ret != 0;
}